

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraCommands.cpp
# Opt level: O1

ResponseLine * __thiscall
SelectGenericCommand::trigger(SelectGenericCommand *this,string_view parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  ResponseLine *pRVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined8 uVar5;
  char *pcVar6;
  size_type sVar7;
  size_type *psVar8;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  undefined1 auVar9 [16];
  size_type __dnew;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  char *local_98;
  size_type *local_90;
  size_type local_88;
  size_type local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  size_type *local_70;
  size_type local_68;
  size_type local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  lVar2 = IRCCommand::selected_server;
  local_30._M_str = parameters._M_str;
  local_30._M_len = parameters._M_len;
  if (local_30._M_len == 0) {
    pRVar3 = (ResponseLine *)operator_new(0x30);
    if (lVar2 == 0) {
      Jupiter::GenericCommand::ResponseLine::ResponseLine
                (pRVar3,0x24,"No IRC server is currently selected.",0);
      return pRVar3;
    }
    auVar9 = Jupiter::IRC::Client::getConfigSection();
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,auVar9._8_8_,auVar9._0_8_ + auVar9._8_8_);
    local_98 = (char *)0x17;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_dataplus._M_p =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   (&local_d8,(size_type *)&local_98,0);
    local_d8.field_2._M_allocated_capacity = (size_type)local_98;
    builtin_strncpy(local_d8._M_dataplus._M_p," is currently selected.",0x17);
    local_d8._M_string_length = (size_type)local_98;
    local_d8._M_dataplus._M_p[(long)local_98] = '\0';
    uVar5 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      uVar5 = local_b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar5 < local_98 + local_b8._M_string_length) {
      pcVar6 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        pcVar6 = local_98;
      }
      if (pcVar6 < local_98 + local_b8._M_string_length) goto LAB_0010bc79;
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_d8,0,0,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    }
    else {
LAB_0010bc79:
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_b8,local_d8._M_dataplus._M_p,(size_type)local_98);
    }
    local_70 = &local_60;
    psVar8 = (size_type *)(pbVar4->_M_dataplus)._M_p;
    paVar1 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8 == paVar1) {
      local_60 = paVar1->_M_allocated_capacity;
      uStack_58 = *(undefined4 *)((long)&pbVar4->field_2 + 8);
      uStack_54 = *(undefined4 *)((long)&pbVar4->field_2 + 0xc);
    }
    else {
      local_60 = paVar1->_M_allocated_capacity;
      local_70 = psVar8;
    }
    local_68 = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar1;
    pbVar4->_M_string_length = 0;
    paVar1->_M_local_buf[0] = '\0';
    Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar3,&local_70,0);
    sVar7 = local_60;
    psVar8 = local_70;
    if (local_70 != &local_60) {
LAB_0010be1c:
      operator_delete(psVar8,sVar7 + 1);
    }
  }
  else {
    if (IRCCommand::active_server == IRCCommand::selected_server) {
      IRCCommand::active_server = 0;
    }
    IRCCommand::selected_server = ServerManager::getServer(_serverManager);
    if (IRCCommand::selected_server == 0) {
      pRVar3 = (ResponseLine *)operator_new(0x30);
      local_b8._M_dataplus._M_p = (pointer)0x13;
      local_b8._M_string_length = 0x11000a;
      local_d8._M_dataplus._M_p = (pointer)0x31;
      local_d8._M_string_length = 0x11001e;
      jessilib::
      join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>
                (&local_50,(jessilib *)&local_b8,&local_30,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_d8,in_R8);
      Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar3,&local_50,2);
      local_b8.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        return pRVar3;
      }
      goto LAB_0010be49;
    }
    if (IRCCommand::active_server == 0) {
      IRCCommand::active_server = IRCCommand::selected_server;
    }
    pRVar3 = (ResponseLine *)operator_new(0x30);
    auVar9 = Jupiter::IRC::Client::getConfigSection();
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,auVar9._8_8_,auVar9._0_8_ + auVar9._8_8_);
    local_98 = (char *)0x11;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_dataplus._M_p =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   (&local_d8,(size_type *)&local_98,0);
    local_d8.field_2._M_allocated_capacity = (size_type)local_98;
    builtin_strncpy(local_d8._M_dataplus._M_p," is now selected.",0x11);
    local_d8._M_string_length = (size_type)local_98;
    local_d8._M_dataplus._M_p[(long)local_98] = '\0';
    uVar5 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      uVar5 = local_b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar5 < local_98 + local_b8._M_string_length) {
      pcVar6 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        pcVar6 = local_98;
      }
      if (pcVar6 < local_98 + local_b8._M_string_length) goto LAB_0010bb8f;
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_d8,0,0,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    }
    else {
LAB_0010bb8f:
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_b8,local_d8._M_dataplus._M_p,(size_type)local_98);
    }
    local_90 = &local_80;
    psVar8 = (size_type *)(pbVar4->_M_dataplus)._M_p;
    paVar1 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8 == paVar1) {
      local_80 = paVar1->_M_allocated_capacity;
      uStack_78 = *(undefined4 *)((long)&pbVar4->field_2 + 8);
      uStack_74 = *(undefined4 *)((long)&pbVar4->field_2 + 0xc);
    }
    else {
      local_80 = paVar1->_M_allocated_capacity;
      local_90 = psVar8;
    }
    local_88 = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar1;
    pbVar4->_M_string_length = 0;
    paVar1->_M_local_buf[0] = '\0';
    Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar3,&local_90,0);
    sVar7 = local_80;
    psVar8 = local_90;
    if (local_90 != &local_80) goto LAB_0010be1c;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,(ulong)(local_d8.field_2._M_allocated_capacity + 1));
  }
  local_50._M_dataplus._M_p = local_b8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
    return pRVar3;
  }
LAB_0010be49:
  operator_delete(local_50._M_dataplus._M_p,(ulong)(local_b8.field_2._M_allocated_capacity + 1));
  return pRVar3;
}

Assistant:

Jupiter::GenericCommand::ResponseLine *SelectGenericCommand::trigger(std::string_view parameters)
{
	if (parameters.empty())
	{
		if (IRCCommand::selected_server == nullptr)
			return new Jupiter::GenericCommand::ResponseLine("No IRC server is currently selected."sv, GenericCommand::DisplayType::PublicSuccess);
		return new Jupiter::GenericCommand::ResponseLine(std::string{IRCCommand::selected_server->getConfigSection()} + " is currently selected."s, GenericCommand::DisplayType::PublicSuccess);
	}
	if (IRCCommand::active_server == IRCCommand::selected_server)
		IRCCommand::active_server = nullptr;

	IRCCommand::selected_server = serverManager->getServer(parameters);
	if (IRCCommand::selected_server == nullptr)
		return new Jupiter::GenericCommand::ResponseLine(jessilib::join<std::string>("Error: IRC server \""sv, parameters, "\" not found. No IRC server is currently selected."sv), GenericCommand::DisplayType::PublicError);

	if (IRCCommand::active_server == nullptr)
		IRCCommand::active_server = IRCCommand::selected_server;
	return new Jupiter::GenericCommand::ResponseLine(std::string{IRCCommand::selected_server->getConfigSection()} + " is now selected."s, GenericCommand::DisplayType::PublicSuccess);
}